

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprMightBeIndexed2(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr)

{
  int iTab;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  Index *pIVar6;
  
  lVar4 = 0;
  if (1 < mPrereq) {
    do {
      lVar4 = lVar4 + 1;
      bVar1 = 3 < mPrereq;
      mPrereq = mPrereq >> 1;
    } while (bVar1);
  }
  pIVar6 = (pFrom->a[lVar4].pTab)->pIndex;
  if (pIVar6 != (Index *)0x0) {
    iTab = pFrom->a[lVar4].iCursor;
    do {
      if ((pIVar6->aColExpr != (ExprList *)0x0) &&
         (uVar3 = (ulong)pIVar6->nKeyCol, pIVar6->nKeyCol != 0)) {
        lVar4 = 4;
        uVar5 = 0;
        do {
          if (pIVar6->aiColumn[uVar5] == -2) {
            iVar2 = sqlite3ExprCompareSkip
                              (pExpr,*(Expr **)((long)pIVar6->aColExpr->a + lVar4 * 2 + -8),iTab);
            if (iVar2 == 0) {
              *aiCurCol = iTab;
              aiCurCol[1] = -2;
              return 1;
            }
            uVar3 = (ulong)pIVar6->nKeyCol;
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (uVar5 < uVar3);
      }
      pIVar6 = pIVar6->pNext;
    } while (pIVar6 != (Index *)0x0);
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int exprMightBeIndexed2(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor and column here */
  Expr *pExpr            /* An operand of a comparison operator */
){
  Index *pIdx;
  int i;
  int iCur;
  for(i=0; mPrereq>1; i++, mPrereq>>=1){}
  iCur = pFrom->a[i].iCursor;
  for(pIdx=pFrom->a[i].pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->aColExpr==0 ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
      if( sqlite3ExprCompareSkip(pExpr, pIdx->aColExpr->a[i].pExpr, iCur)==0 ){
        aiCurCol[0] = iCur;
        aiCurCol[1] = XN_EXPR;
        return 1;
      }
    }
  }
  return 0;
}